

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O2

ImPlotTick * __thiscall ImPlotTickCollection::Append(ImPlotTickCollection *this,ImPlotTick *tick)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImPlotTick *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (tick->ShowLabel == true) {
    fVar1 = (tick->LabelSize).x;
    this->TotalWidth = this->TotalWidth + fVar1;
    fVar2 = (tick->LabelSize).y;
    this->TotalHeight = this->TotalHeight + fVar2;
    uVar3 = this->MaxWidth;
    uVar4 = this->MaxHeight;
    auVar7._4_4_ = uVar4;
    auVar7._0_4_ = uVar3;
    auVar6._4_4_ = fVar2;
    auVar6._0_4_ = fVar1;
    auVar6._8_8_ = 0;
    auVar7._8_8_ = 0;
    auVar7 = maxps(auVar6,auVar7);
    this->MaxWidth = (float)(int)auVar7._0_8_;
    this->MaxHeight = (float)(int)((ulong)auVar7._0_8_ >> 0x20);
  }
  ImVector<ImPlotTick>::push_back(&this->Ticks,tick);
  this->Size = this->Size + 1;
  pIVar5 = ImVector<ImPlotTick>::back(&this->Ticks);
  return pIVar5;
}

Assistant:

const ImPlotTick& Append(const ImPlotTick& tick) {
        if (tick.ShowLabel) {
            TotalWidth    += tick.ShowLabel ? tick.LabelSize.x : 0;
            TotalHeight   += tick.ShowLabel ? tick.LabelSize.y : 0;
            MaxWidth      =  tick.LabelSize.x > MaxWidth  ? tick.LabelSize.x : MaxWidth;
            MaxHeight     =  tick.LabelSize.y > MaxHeight ? tick.LabelSize.y : MaxHeight;
        }
        Ticks.push_back(tick);
        Size++;
        return Ticks.back();
    }